

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transitions.hpp
# Opt level: O1

event_process_result __thiscall
afsm::transitions::
state_transition_table<afsm::inner_state_machine<afsm::test::b::inner_dispatch_test,_afsm::test::b::dummy_sm>,_afsm::test::b::inner_dispatch_test,_unsigned_long>
::process_event<afsm::test::b::inner_event>
          (state_transition_table<afsm::inner_state_machine<afsm::test::b::inner_dispatch_test,_afsm::test::b::dummy_sm>,_afsm::test::b::inner_dispatch_test,_unsigned_long>
           *this,inner_event *event)

{
  event_process_result eVar1;
  
  eVar1 = actions::detail::
          inner_dispatch_table<std::tuple<afsm::state<afsm::test::b::inner_dispatch_test::state_b,_afsm::inner_state_machine<afsm::test::b::inner_dispatch_test,_afsm::test::b::dummy_sm>_>,_afsm::state<afsm::test::b::inner_dispatch_test::state_c,_afsm::inner_state_machine<afsm::test::b::inner_dispatch_test,_afsm::test::b::dummy_sm>_>,_afsm::state<afsm::test::b::inner_dispatch_test::state_a,_afsm::inner_state_machine<afsm::test::b::inner_dispatch_test,_afsm::test::b::dummy_sm>_>_>_>
          ::process_event<afsm::test::b::inner_event>(&this->states_,this->current_state_,event);
  if (eVar1 == refuse) {
    eVar1 = process_transition_event<afsm::test::b::inner_event>(this,event);
  }
  if (eVar1 == process) {
    check_default_transition(this);
  }
  return eVar1;
}

Assistant:

actions::event_process_result
    process_event(Event&& event)
    {
        // Try dispatch to inner states
        auto res = dispatch_table::process_event(states_, current_state(),
                ::std::forward<Event>(event));
        if (res == actions::event_process_result::refuse) {
            // Check if the event can cause a transition and process it
            res = process_transition_event(::std::forward<Event>(event));
        }
        if (res == actions::event_process_result::process) {
            check_default_transition();
        }
        return res;
    }